

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_20::FieldValuePrinterWrapper::PrintString
          (FieldValuePrinterWrapper *this,string *val,BaseTextGenerator *generator)

{
  FieldValuePrinter *pFVar1;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  pFVar1 = (this->delegate_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
           _M_head_impl;
  (*pFVar1->_vptr_FieldValuePrinter[9])(&local_38,pFVar1,val);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void PrintString(const std::string& val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintString(val));
  }